

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuralnet.cpp
# Opt level: O3

void __thiscall indk::NeuralNet::doParseLinks(NeuralNet *this,EntryList *entries,string *id)

{
  size_t __n;
  pointer pbVar1;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
  *p_Var2;
  pointer ptVar3;
  pointer ptVar4;
  long lVar5;
  byte bVar6;
  _Base_ptr p_Var7;
  _Head_base<3UL,_void_*,_false> _Var8;
  int iVar9;
  _Rb_tree_color _Var10;
  iterator iVar11;
  iterator iVar12;
  ulong uVar13;
  _Rb_tree_color _Var14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *en;
  pointer __args_1;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
  *p_Var15;
  bool bVar16;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *e;
  pointer __args;
  bool bVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *nl;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__k;
  pointer ptVar18;
  int shift;
  __tuple_element_t<1UL,_tuple<basic_string<char>,_basic_string<char>,_void_*,_long>_> to;
  __tuple_element_t<0UL,_tuple<basic_string<char>,_basic_string<char>,_void_*,_long>_> from;
  LinkList *__range3;
  __tuple_element_t<3UL,_tuple<basic_string<char>,_basic_string<char>,_void_*,_long>_> latency;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nlinks;
  value_type i;
  NQueue nqueue;
  int local_1cc;
  NeuralNet *local_1c8;
  pointer local_1c0;
  key_type local_1b8;
  key_type local_198;
  _Base_ptr local_178;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>_>
  *local_170;
  string *local_168;
  string *local_160;
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,void*,int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,void*,int>>>
  *local_158;
  _Base_ptr local_150;
  _Base_ptr local_148;
  void *local_140;
  long local_138;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
  local_130;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>
  local_d8;
  _Deque_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>_>_>
  local_88;
  
  __n = id->_M_string_length;
  local_1c8 = this;
  if ((__n != (this->PrepareID)._M_string_length) ||
     ((__n != 0 &&
      (iVar9 = bcmp((id->_M_dataplus)._M_p,(this->PrepareID)._M_dataplus._M_p,__n), iVar9 != 0)))) {
    local_158 = (vector<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,void*,int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,void*,int>>>
                 *)&local_1c8->Links;
    local_168 = (string *)&this->PrepareID;
    local_160 = id;
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>_>_>
    ::_M_erase_at_end((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>_>_>
                       *)local_158,
                      (local_1c8->Links).
                      super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
    std::
    _Deque_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>_>_>
    ::_M_initialize_map(&local_88,0);
    __args = (entries->
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_1c0 = (entries->
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    if (__args != local_1c0) {
      do {
        pbVar1 = (__args->second).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (__args_1 = (__args->second).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start; __args_1 != pbVar1;
            __args_1 = __args_1 + 1) {
          local_130.
          super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
          .super__Tuple_impl<2UL,_void_*,_void_*,_int>.super__Tuple_impl<3UL,_void_*,_int>._0_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_d8.
          super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>
          .super__Tuple_impl<2UL,_void_*,_long>.super__Tuple_impl<3UL,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl._0_4_ = 0;
          std::
          deque<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,long>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,long>>>
          ::
          emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&,decltype(nullptr),int>
                    ((deque<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,long>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,long>>>
                      *)&local_88,&__args->first,__args_1,(void **)&local_130,(int *)&local_d8);
        }
        __args = __args + 1;
      } while (__args != local_1c0);
    }
    if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
      local_170 = &local_1c8->Neurons;
      local_178 = &(local_1c8->Neurons)._M_t._M_impl.super__Rb_tree_header._M_header;
      local_1c0 = (pointer)&local_1c8->Latencies;
      local_150 = &(local_1c8->Latencies)._M_t._M_impl.super__Rb_tree_header._M_header;
      do {
        std::
        _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>
        ::_Tuple_impl(&local_d8,
                      &(local_88._M_impl.super__Deque_impl_data._M_start._M_cur)->
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>
                     );
        std::
        deque<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>_>_>
        ::pop_front((deque<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>_>_>
                     *)&local_88);
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_198,
                   local_d8.
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                   ._M_head_impl._M_dataplus._M_p,
                   local_d8.
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                   ._M_head_impl._M_dataplus._M_p +
                   local_d8.
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                   ._M_head_impl._M_string_length);
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1b8,
                   local_d8.
                   super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>
                   .
                   super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                   ._M_head_impl._M_dataplus._M_p,
                   local_d8.
                   super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>
                   .
                   super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                   ._M_head_impl._M_dataplus._M_p +
                   local_d8.
                   super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>
                   .
                   super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                   ._M_head_impl._M_string_length);
        local_138 = CONCAT44(local_d8.
                             super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>
                             .super__Tuple_impl<2UL,_void_*,_long>.super__Tuple_impl<3UL,_long>.
                             super__Head_base<3UL,_long,_false>._M_head_impl._4_4_,
                             (undefined4)
                             local_d8.
                             super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>
                             .super__Tuple_impl<2UL,_void_*,_long>.super__Tuple_impl<3UL,_long>.
                             super__Head_base<3UL,_long,_false>._M_head_impl);
        local_148 = (_Base_ptr)
                    std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>_>
                    ::find(&local_170->_M_t,&local_1b8);
        if (local_148 != local_178) {
          p_Var15 = &((local_1c8->Links).
                      super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
          ;
          p_Var2 = &((local_1c8->Links).
                     super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
          ;
          if (p_Var15 != p_Var2) {
            bVar16 = false;
            do {
              std::
              _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
              ::_Tuple_impl(&local_130,p_Var15);
              if ((local_198._M_string_length ==
                   local_130.
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                   ._M_head_impl._M_string_length) &&
                 (((local_198._M_string_length == 0 ||
                   (iVar9 = bcmp(local_198._M_dataplus._M_p,
                                 local_130.
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                 ._M_head_impl._M_dataplus._M_p,local_198._M_string_length),
                   iVar9 == 0)) &&
                  (local_1b8._M_string_length ==
                   local_130.
                   super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
                   .
                   super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                   ._M_head_impl._M_string_length)))) {
                bVar17 = true;
                if (local_1b8._M_string_length == 0) {
                  bVar6 = 1;
                }
                else {
                  iVar9 = bcmp(local_1b8._M_dataplus._M_p,
                               local_130.
                               super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
                               .
                               super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                               ._M_head_impl._M_dataplus._M_p,local_1b8._M_string_length);
                  bVar6 = 1;
                  if (iVar9 != 0) goto LAB_00165fe5;
                }
              }
              else {
LAB_00165fe5:
                bVar6 = 0;
                bVar17 = bVar16;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_130.
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                     ._M_head_impl._M_dataplus._M_p !=
                  &local_130.
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                   ._M_head_impl.field_2) {
                operator_delete(local_130.
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                ._M_head_impl._M_dataplus._M_p,
                                local_130.
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                ._M_head_impl.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_130.
                     super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
                     .
                     super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                     ._M_head_impl._M_dataplus._M_p !=
                  &local_130.
                   super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
                   .
                   super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                   ._M_head_impl.field_2) {
                operator_delete(local_130.
                                super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
                                .
                                super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                ._M_head_impl._M_dataplus._M_p,
                                local_130.
                                super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
                                .
                                super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                ._M_head_impl.field_2._M_allocated_capacity + 1);
              }
              p_Var15 = p_Var15 + 1;
              bVar16 = bVar17;
            } while (!(bool)(bVar6 | p_Var15 == p_Var2));
            if (bVar17) goto LAB_00166169;
          }
          iVar11 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>_>
                   ::find(&local_170->_M_t,&local_198);
          p_Var7 = local_148;
          if (iVar11._M_node != local_178) {
            std::
            vector<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,void*,int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,void*,int>>>
            ::
            emplace_back<std::__cxx11::string&,std::__cxx11::string&,indk::Neuron*&,indk::Neuron*&,long&>
                      (local_158,&local_198,&local_1b8,(Neuron **)(iVar11._M_node + 2),
                       (Neuron **)(local_148 + 2),&local_138);
          }
          Neuron::getLinkOutput_abi_cxx11_
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_130,*(Neuron **)(p_Var7 + 2));
          _Var8._M_head_impl =
               local_130.
               super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
               .super__Tuple_impl<2UL,_void_*,_void_*,_int>.super__Tuple_impl<3UL,_void_*,_int>.
               super__Head_base<3UL,_void_*,_false>._M_head_impl;
          p_Var7 = local_150;
          for (__k = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_130.
                     super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
                     .super__Tuple_impl<2UL,_void_*,_void_*,_int>.
                     super__Tuple_impl<3UL,_void_*,_int>._0_8_;
              __k != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     _Var8._M_head_impl; __k = __k + 1) {
            local_1cc = 0;
            iVar12 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)local_1c0,__k);
            if (iVar12._M_node == p_Var7) {
              _Var14 = _S_red;
            }
            else {
              _Var14 = iVar12._M_node[2]._M_color;
            }
            iVar12 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)local_1c0,&local_1b8);
            if (iVar12._M_node == p_Var7) {
              _Var10 = _S_red;
            }
            else {
              _Var10 = iVar12._M_node[2]._M_color;
            }
            local_1cc = _Var14 - _Var10;
            local_140 = (void *)0x0;
            std::
            deque<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,long>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,long>>>
            ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,decltype(nullptr),int&>
                      ((deque<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,long>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,long>>>
                        *)&local_88,&local_1b8,__k,&local_140,&local_1cc);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_130);
        }
LAB_00166169:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8.
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
               ._M_head_impl._M_dataplus._M_p !=
            &local_d8.
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
             ._M_head_impl.field_2) {
          operator_delete(local_d8.
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                          ._M_head_impl._M_dataplus._M_p,
                          local_d8.
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                          ._M_head_impl.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8.
               super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>
               .
               super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
               ._M_head_impl._M_dataplus._M_p !=
            &local_d8.
             super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>
             .
             super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
             ._M_head_impl.field_2) {
          operator_delete(local_d8.
                          super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>
                          .
                          super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                          ._M_head_impl._M_dataplus._M_p,
                          local_d8.
                          super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>
                          .
                          super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                          ._M_head_impl.field_2._M_allocated_capacity + 1);
        }
      } while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
               local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
    }
    ptVar3 = (local_1c8->Links).
             super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ptVar4 = (local_1c8->Links).
             super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ptVar3 != ptVar4) {
      uVar13 = ((long)ptVar4 - (long)ptVar3 >> 3) * 0x2e8ba2e8ba2e8ba3;
      lVar5 = 0x3f;
      if (uVar13 != 0) {
        for (; uVar13 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,void*,int>*,std::vector<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,void*,int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,void*,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<indk::NeuralNet::doParseLinks(std::vector<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>const&,std::__cxx11::string_const&)::__0>>
                (ptVar3,ptVar4,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)ptVar4 - (long)ptVar3 < 0x581) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,void*,int>*,std::vector<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,void*,int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,void*,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<indk::NeuralNet::doParseLinks(std::vector<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>const&,std::__cxx11::string_const&)::__0>>
                  (ptVar3,ptVar4);
      }
      else {
        ptVar18 = ptVar3 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,void*,int>*,std::vector<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,void*,int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,void*,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<indk::NeuralNet::doParseLinks(std::vector<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>const&,std::__cxx11::string_const&)::__0>>
                  (ptVar3,ptVar18);
        for (; ptVar18 != ptVar4; ptVar18 = ptVar18 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,void*,int>*,std::vector<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,void*,int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,void*,int>>>>,__gnu_cxx::__ops::_Val_comp_iter<indk::NeuralNet::doParseLinks(std::vector<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>const&,std::__cxx11::string_const&)::__0>>
                    (ptVar18);
        }
      }
    }
    std::__cxx11::string::_M_assign(local_168);
    std::
    deque<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>_>_>
    ::~deque((deque<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>_>_>
              *)&local_88);
  }
  return;
}

Assistant:

void indk::NeuralNet::doParseLinks(const EntryList& entries, const std::string& id) {
    if (id == PrepareID) return;

    Links.clear();

    NQueue nqueue;

    for (auto &e: entries) {
        for (auto &en: e.second) {
            nqueue.emplace(e.first, en, nullptr, 0);
        }
    }

    while (!nqueue.empty()) {
        auto i = nqueue.front();
        nqueue.pop();

        auto from = std::get<0>(i);
        auto to = std::get<1>(i);
        auto latency = std::get<3>(i);

        auto n = Neurons.find(to);

        if (n != Neurons.end()) {
            bool skip = false;
            for (auto l: Links) {
                if (from == std::get<0>(l) && to == std::get<1>(l)) {
                    skip = true;
                    break;
                }
            }
            if (skip) continue;
            auto nprev = Neurons.find(from);
            auto type = 0;
            if (nprev != Neurons.end()) Links.emplace_back(from, to, nprev->second, n->second, latency);

            auto nlinks = n -> second -> getLinkOutput();
            for (auto &nl: nlinks) {
                auto shift = 0;
                auto nlatency = 0;
                auto lnext = Latencies.find(nl);
                if (lnext != Latencies.end()) nlatency = lnext -> second;
                auto lto = Latencies.find(to);
                auto latencyto = lto != Latencies.end() ? lto->second : 0;
                shift = nlatency-latencyto;
                nqueue.emplace(to, nl, nullptr, shift);
            }
        }
    }

    std::sort(Links.begin(), Links.end(), [] (const indk::LinkDefinition& l1, const indk::LinkDefinition& l2) {
        if (std::get<4>(l1) < std::get<4>(l2)) return true;
        return false;
    });

//    std::cout << std::endl;
//    for (auto l: Links) {
//        std::cerr << std::get<0>(l) << " -> " << std::get<1>(l) << " " << std::get<4>(l) << std::endl;
//    }

    PrepareID = id;
}